

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

bool parse_instruction(context *ctx,opcode *op)

{
  int iVar1;
  const_reference pvVar2;
  type *this;
  type_conflict1 *ptVar3;
  size_type sVar4;
  const_pointer pvVar5;
  opcode *op_00;
  context *string;
  bool bVar6;
  type_conflict1 *score;
  type *insn_error;
  insn *local_1d0;
  insn *insn;
  size_t i;
  size_t num_insns;
  int error_score;
  error error_message;
  opcode saved_op;
  context saved_context;
  undefined1 local_78 [8];
  error message;
  token_type tStack_58;
  undefined1 auStack_48 [8];
  token token;
  opcode *op_local;
  context *ctx_local;
  
  token._32_8_ = op;
  context::tokenize((token *)auStack_48,ctx);
  if (token.data._8_4_ == 0) {
    ctx_local._7_1_ = 0;
LAB_0012b745:
    return (bool)(ctx_local._7_1_ & 1);
  }
  while( true ) {
    bVar6 = false;
    if (token.data._8_4_ == 1) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&token,0);
      bVar6 = *pvVar2 == '.';
    }
    if (!bVar6) break;
    context::parse_option(ctx,(token *)auStack_48);
  }
  if (ctx->pc % 0x20 == 0) {
    ctx->pc = ctx->pc + 8;
  }
  if (token.data._8_4_ == 0xc) {
    context::tokenize((token *)&message,ctx);
    token.data._8_4_ = tStack_58;
    auStack_48 = (undefined1  [8])
                 message.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                 .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
    op_00 = (opcode *)auStack_48;
    assemble_predicate((token *)local_78,op_00,token._32_8_,0x10);
    iVar1 = (int)op_00;
    bVar6 = error::operator_cast_to_bool((error *)local_78);
    if (bVar6) {
      error::raise((error *)local_78,iVar1);
    }
    error::~error((error *)local_78);
    context::tokenize((token *)&saved_context.num_barriers,ctx);
    memcpy(auStack_48,&saved_context.num_barriers,0x24);
  }
  else {
    opcode::add_bits((opcode *)token._32_8_,0x70000);
  }
  if (token.data._8_4_ != 1) {
    fatal_error((token *)auStack_48,"expected mnemonic");
  }
  string = ctx;
  context::context((context *)&saved_op.reuse,ctx);
  error_message.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = *(unique_ptr<char[],_std::default_delete<char[]>_> *)token._32_8_;
  saved_op.value = *(uint64_t *)(token._32_8_ + 8);
  error::error((error *)&stack0xfffffffffffffe50);
  num_insns._4_4_ = -1;
  i = 0x109;
  insn = (insn *)0x0;
  do {
    iVar1 = (int)string;
    if ((insn *)0x108 < insn) {
      bVar6 = error::operator_cast_to_bool((error *)&stack0xfffffffffffffe50);
      if (bVar6) {
        error::raise((error *)&stack0xfffffffffffffe50,iVar1);
      }
      sVar4 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string_view<char,_std::char_traits<char>_> *)&token);
      pvVar5 = std::data<std::basic_string_view<char,std::char_traits<char>>>
                         ((basic_string_view<char,_std::char_traits<char>_> *)&token);
      fatal_error((token *)auStack_48,"unknown mnemonic \x1b[1m%.*s\x1b[0m",sVar4,pvVar5);
    }
    local_1d0 = table + (long)insn;
    string = (context *)table[(long)insn].mnemonic;
    iVar1 = equal((token *)auStack_48,(char *)string);
    if (iVar1 != 0) {
      string = ctx;
      parse_insn((context *)&insn_error,(opcode *)ctx,(insn *)token._32_8_);
      this = std::get<0ul,error,int>((pair<error,_int> *)&insn_error);
      ptVar3 = std::get<1ul,error,int>((pair<error,_int> *)&insn_error);
      bVar6 = error::operator_cast_to_bool(this);
      if (bVar6) {
        if (num_insns._4_4_ < *ptVar3) {
          error::operator=((error *)&stack0xfffffffffffffe50,this);
          num_insns._4_4_ = *ptVar3;
        }
        string = (context *)&saved_op.reuse;
        context::operator=(ctx,string);
        *(unique_ptr<char[],_std::default_delete<char[]>_> *)token._32_8_ =
             error_message.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
             _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
        *(uint64_t *)(token._32_8_ + 8) = saved_op.value;
        bVar6 = false;
      }
      else {
        ctx->pc = ctx->pc + 8;
        ctx_local._7_1_ = 1;
        bVar6 = true;
      }
      std::pair<error,_int>::~pair((pair<error,_int> *)&insn_error);
      if (bVar6) {
        error::~error((error *)&stack0xfffffffffffffe50);
        context::~context((context *)&saved_op.reuse);
        goto LAB_0012b745;
      }
    }
    insn = (insn *)((long)&insn->opcode + 1);
  } while( true );
}

Assistant:

bool parse_instruction(context& ctx, opcode& op)
{
    token token = ctx.tokenize();
    if (token.type == token_type::none) {
        return false;
    }
    while (token.type == token_type::identifier && token.data.string[0] == '.') {
        ctx.parse_option(token);
    }
    if (ctx.pc % 0x20 == 0) {
        ctx.pc += 8;
    }
    if (token.type == token_type::at) {
        token = ctx.tokenize();
        if (error message = assemble_predicate(token, op, 16, 1); message) {
            message.raise();
        }
        token = ctx.tokenize();
    } else {
        // write always execute by default
        op.add_bits(7ULL << 16);
    }
    if (token.type != token_type::identifier) {
        fatal_error(token, "expected mnemonic");
    }
    const context saved_context = ctx;
    const opcode saved_op = op;
    error error_message;
    int error_score = -1;

    const size_t num_insns = sizeof(table) / sizeof(table[0]);
    for (size_t i = 0; i < num_insns; ++i) {
        const insn& insn = table[i];
        if (!equal(token, insn.mnemonic)) {
            continue;
        }
        auto [insn_error, score] = parse_insn(ctx, op, insn);
        if (!insn_error) {
            // successfully decoded instruction
            ctx.pc += 8;
            return true;
        }
        if (score > error_score) {
            error_message = std::move(insn_error);
            error_score = score;
        }
        // failure, restore context
        ctx = saved_context;
        op = saved_op;
    }
    if (error_message) {
        error_message.raise();
    } else {
        fatal_error(token, "unknown mnemonic \33[1m%.*s\33[0m", std::size(token.data.string),
                    std::data(token.data.string));
    }
}